

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabwidget.cpp
# Opt level: O1

void __thiscall QTabWidget::initStyleOption(QTabWidget *this,QStyleOptionTabWidgetFrame *option)

{
  int iVar1;
  QTabWidgetPrivate *this_00;
  QTabBar *pQVar2;
  QWidgetData *pQVar3;
  QWidget *pQVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  QStyle *pQVar9;
  ulong uVar10;
  ulong uVar11;
  QSize QVar12;
  QSize QVar13;
  ulong uVar14;
  QRect QVar15;
  
  if (option != (QStyleOptionTabWidgetFrame *)0x0) {
    this_00 = *(QTabWidgetPrivate **)&(this->super_QWidget).field_0x8;
    QTabWidgetPrivate::initBasicStyleOption(this_00,option);
    pQVar9 = QWidget::style(&this->super_QWidget);
    uVar10 = 0;
    iVar6 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x16,0);
    uVar7 = QFrame::frameWidth(&this_00->stack->super_QFrame);
    uVar14 = (ulong)uVar7;
    bVar5 = QWidget::isVisibleTo(&this_00->tabs->super_QWidget,&this->super_QWidget);
    if (bVar5) {
      uVar10 = (**(code **)(*(long *)&this_00->tabs->super_QWidget + 0x70))();
      uVar14 = uVar10 >> 0x20;
      pQVar2 = *(QTabBar **)(*(long *)&(this->super_QWidget).field_0x8 + 600);
      if (pQVar2 != (QTabBar *)0x0) {
        bVar5 = QTabBar::documentMode(pQVar2);
        if (bVar5) {
          pQVar3 = (this->super_QWidget).data;
          if ((*(uint *)(*(long *)&(this->super_QWidget).field_0x8 + 0x27c) & 0xfffffffe) == 2) {
            uVar14 = (ulong)(((pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i) + 1);
          }
          else {
            uVar10 = (ulong)(((pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i) + 1);
          }
        }
      }
    }
    pQVar4 = this_00->rightCornerWidget;
    if ((pQVar4 == (QWidget *)0x0) || ((pQVar4->data->widget_attributes & 0x8000) == 0)) {
      QVar12.wd.m_i = 0;
      QVar12.ht.m_i = 0;
    }
    else {
      uVar11 = (**(code **)(*(long *)pQVar4 + 0x70))();
      uVar7 = (int)uVar14 - iVar6;
      uVar8 = (uint)(uVar11 >> 0x20);
      if ((int)uVar8 < (int)uVar7) {
        uVar7 = uVar8;
      }
      QVar12 = (QSize)(uVar11 & 0xffffffff | (ulong)uVar7 << 0x20);
    }
    option->rightCornerWidgetSize = QVar12;
    pQVar4 = this_00->leftCornerWidget;
    if ((pQVar4 == (QWidget *)0x0) || ((pQVar4->data->widget_attributes & 0x8000) == 0)) {
      QVar13.wd.m_i = 0;
      QVar13.ht.m_i = 0;
    }
    else {
      uVar11 = (**(code **)(*(long *)pQVar4 + 0x70))();
      uVar7 = (int)uVar14 - iVar6;
      uVar8 = (uint)(uVar11 >> 0x20);
      if ((int)uVar8 < (int)uVar7) {
        uVar7 = uVar8;
      }
      QVar13 = (QSize)(uVar11 & 0xffffffff | (ulong)uVar7 << 0x20);
    }
    option->leftCornerWidgetSize = QVar13;
    option->tabBarSize = (QSize)(uVar10 & 0xffffffff | uVar14 << 0x20);
    pQVar2 = *(QTabBar **)(*(long *)&(this->super_QWidget).field_0x8 + 600);
    iVar6 = QTabBar::currentIndex(pQVar2);
    QVar15 = QTabBar::tabRect(pQVar2,iVar6);
    iVar6 = (option->tabBarRect).x1.m_i;
    iVar1 = (option->tabBarRect).y1.m_i;
    (option->selectedTabRect).x1 = (Representation)(QVar15.x1.m_i.m_i + iVar6);
    (option->selectedTabRect).y1 = (Representation)(QVar15.y1.m_i.m_i + iVar1);
    (option->selectedTabRect).x2 = (Representation)(iVar6 + QVar15.x2.m_i.m_i);
    (option->selectedTabRect).y2 = (Representation)(QVar15.y2.m_i.m_i + iVar1);
  }
  return;
}

Assistant:

void QTabWidget::initStyleOption(QStyleOptionTabWidgetFrame *option) const
{
    if (!option)
        return;

    Q_D(const QTabWidget);
    d->initBasicStyleOption(option);

    int exth = style()->pixelMetric(QStyle::PM_TabBarBaseHeight, nullptr, this);
    QSize t(0, d->stack->frameWidth());
    if (d->tabs->isVisibleTo(const_cast<QTabWidget *>(this))) {
        t = d->tabs->sizeHint();
        if (documentMode()) {
            if (tabPosition() == East || tabPosition() == West) {
                t.setHeight(height());
            } else {
                t.setWidth(width());
            }
        }
    }

    if (d->rightCornerWidget && d->rightCornerWidget->isVisible()) {
        const QSize rightCornerSizeHint = d->rightCornerWidget->sizeHint();
        const QSize bounds(rightCornerSizeHint.width(), t.height() - exth);
        option->rightCornerWidgetSize = rightCornerSizeHint.boundedTo(bounds);
    } else {
        option->rightCornerWidgetSize = QSize(0, 0);
    }

    if (d->leftCornerWidget && d->leftCornerWidget->isVisible()) {
        const QSize leftCornerSizeHint = d->leftCornerWidget->sizeHint();
        const QSize bounds(leftCornerSizeHint.width(), t.height() - exth);
        option->leftCornerWidgetSize = leftCornerSizeHint.boundedTo(bounds);
    } else {
        option->leftCornerWidgetSize = QSize(0, 0);
    }

    option->tabBarSize = t;

    QRect selectedTabRect = tabBar()->tabRect(tabBar()->currentIndex());
    selectedTabRect.moveTopLeft(selectedTabRect.topLeft() + option->tabBarRect.topLeft());
    option->selectedTabRect = selectedTabRect;
}